

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O2

void convolve_horiz(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                   InterpKernel *x_filters,int x0_q4,int x_step_q4,int w,int h)

{
  int iVar1;
  long lVar2;
  uint8_t *puVar3;
  int sum;
  int iVar4;
  int x_q4;
  uint uVar5;
  int x;
  ulong uVar6;
  
  puVar3 = src + -3;
  if (w < 1) {
    w = 0;
  }
  if (h < 1) {
    h = 0;
  }
  for (iVar1 = 0; iVar1 != h; iVar1 = iVar1 + 1) {
    uVar5 = x0_q4;
    for (uVar6 = 0; uVar6 != (uint)w; uVar6 = uVar6 + 1) {
      iVar4 = 0;
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
        iVar4 = iVar4 + (int)*(short *)((long)*x_filters + lVar2 * 2 + (ulong)((uVar5 & 0xf) << 4))
                        * (uint)puVar3[lVar2 + ((int)uVar5 >> 4)];
      }
      iVar4 = iVar4 + 0x40 >> 7;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      dst[uVar6] = (uint8_t)iVar4;
      uVar5 = uVar5 + x_step_q4;
    }
    puVar3 = puVar3 + src_stride;
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

static void convolve_horiz(const uint8_t *src, ptrdiff_t src_stride,
                           uint8_t *dst, ptrdiff_t dst_stride,
                           const InterpKernel *x_filters, int x0_q4,
                           int x_step_q4, int w, int h) {
  src -= SUBPEL_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_q4 = x0_q4;
    for (int x = 0; x < w; ++x) {
      const uint8_t *const src_x = &src[x_q4 >> SUBPEL_BITS];
      const int16_t *const x_filter = x_filters[x_q4 & SUBPEL_MASK];
      const int sum = horz_scalar_product(src_x, x_filter);
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      x_q4 += x_step_q4;
    }
    src += src_stride;
    dst += dst_stride;
  }
}